

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.hpp
# Opt level: O1

void __thiscall
cpptrace::detail::panic(detail *this,char *signature,source_location location,string *message)

{
  int iVar1;
  internal_error *this_00;
  detail *local_40;
  char *local_38;
  int local_30 [2];
  pointer local_28;
  
  local_30[0] = (int)location.file;
  local_40 = this;
  local_38 = signature;
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (location._8_8_,"");
  this_00 = (internal_error *)__cxa_allocate_exception(0x28);
  if (iVar1 == 0) {
    internal_error::internal_error<char_const*const&,int_const&,char_const*&>
              (this_00,"Cpptrace panic {}:{}: {}\n",&local_38,local_30,(char **)&local_40);
    __cxa_throw(this_00,&internal_error::typeinfo,internal_error::~internal_error);
  }
  local_28 = ((location._8_8_)->_M_dataplus)._M_p;
  internal_error::internal_error<char_const*const&,int_const&,char_const*&,char_const*>
            (this_00,"Cpptrace panic {}:{}: {}: {}\n",&local_38,local_30,(char **)&local_40,
             &local_28);
  __cxa_throw(this_00,&internal_error::typeinfo,internal_error::~internal_error);
}

Assistant:

[[noreturn]] inline void panic(
        const char* signature,
        source_location location,
        const std::string& message = ""
    ) {
        if(message == "") {
            throw internal_error(
                "Cpptrace panic {}:{}: {}\n",
                location.file, location.line, signature
            );
        } else {
            throw internal_error(
                "Cpptrace panic {}:{}: {}: {}\n",
                location.file, location.line, signature, message.c_str()
            );
        }
    }